

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

void __thiscall wasm_extern_t::wasm_extern_t(wasm_extern_t *this,RefPtr<wabt::interp::Extern> *ptr)

{
  Object *pOVar1;
  Store *this_00;
  Index index;
  Index IVar2;
  
  pOVar1 = &ptr->obj_->super_Object;
  this_00 = ptr->store_;
  if (this_00 == (Store *)0x0) {
    index = 0;
  }
  else {
    index = wabt::interp::Store::CopyRoot(this_00,ptr->root_index_);
  }
  (this->super_wasm_ref_t).I.obj_ = pOVar1;
  (this->super_wasm_ref_t).I.store_ = this_00;
  if (this_00 == (Store *)0x0) {
    IVar2 = 0;
  }
  else {
    IVar2 = wabt::interp::Store::CopyRoot(this_00,index);
  }
  (this->super_wasm_ref_t).I.root_index_ = IVar2;
  if (pOVar1 != (Object *)0x0) {
    wabt::interp::Store::DeleteRoot(this_00,index);
    return;
  }
  return;
}

Assistant:

wasm_extern_t(RefPtr<Extern> ptr) : wasm_ref_t(ptr) {}